

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O0

Vector<int,_2> __thiscall tcu::Vector<int,_3>::toWidth<2>(Vector<int,_3> *this)

{
  int iVar1;
  long in_RSI;
  int local_1c;
  int i;
  Vector<int,_3> *this_local;
  Vector<int,_2> *res;
  
  Vector<int,_2>::Vector((Vector<int,_2> *)this);
  for (local_1c = 0; iVar1 = ::deMin32(3,2), local_1c < iVar1; local_1c = local_1c + 1) {
    this->m_data[local_1c] = *(int *)(in_RSI + (long)local_1c * 4);
  }
  for (; local_1c < 2; local_1c = local_1c + 1) {
    this->m_data[local_1c] = 0;
  }
  return (Vector<int,_2>)(int  [2])this;
}

Assistant:

inline Vector<T, NewSize> Vector<T, Size>::toWidth (void) const
{
	Vector<T, NewSize> res;
	int i;
	for (i = 0; i < deMin32(Size, NewSize); i++)
		res.m_data[i] = m_data[i];
	for (; i < NewSize; i++)
		res.m_data[i] = T(0);
	return res;
}